

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  bool bVar1;
  int iVar2;
  cmGeneratorTarget *pcVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmMakefile *this_00;
  ulong uVar5;
  cmLocalNinjaGenerator *pcVar6;
  undefined4 extraout_var;
  pointer this_01;
  string *psVar7;
  string_view sVar8;
  cmOutputConverter *local_10d8;
  string local_1008;
  string local_fe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  undefined1 local_fa8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_1;
  string local_f88;
  undefined1 local_f68 [8];
  cmNinjaRule rule_2;
  string local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e00;
  undefined1 local_de0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string local_dc0;
  undefined1 local_da0 [8];
  cmNinjaRule rule_1;
  undefined1 local_c68 [8];
  string cmakeCommand;
  Names tgtNames;
  char local_b79;
  string local_b78;
  cmAlphaNum local_b58;
  cmAlphaNum local_b28;
  string local_af8;
  char local_ad1;
  char *local_ad0;
  char local_ac1;
  string local_ac0;
  cmAlphaNum local_aa0;
  cmAlphaNum local_a70;
  string local_a40;
  string local_a20;
  string local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9e0;
  allocator<char> local_9d1;
  value_type local_9d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9b0;
  const_iterator local_9a8;
  cmAlphaNum local_998;
  cmAlphaNum local_968;
  string local_938;
  string *local_918;
  string *linkCmd;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  cmAlphaNum local_8a8;
  string local_878;
  string *local_858;
  allocator<char> local_849;
  string local_848;
  cmValue local_828;
  cmValue val;
  string launcher;
  undefined1 local_7f0 [8];
  string linkerLauncher;
  string langFlags;
  string local_790 [32];
  int local_770;
  int local_76c;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_5f0 [8];
  ostringstream majorStream;
  string local_478 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  cmValue local_418;
  cmValue flag;
  string cmakeLinkVar;
  cmAlphaNum local_3d0;
  cmAlphaNum local_3a0;
  undefined1 local_370 [8];
  string cmakeVarLang;
  string responseFlag;
  undefined1 local_310 [8];
  string lang;
  RuleVariables vars;
  undefined1 local_180 [8];
  cmNinjaRule rule;
  undefined1 local_48 [8];
  string linkRuleName;
  TargetType targetType;
  string *config_local;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  linkRuleName.field_2._12_4_ = cmGeneratorTarget::GetType(pcVar3);
  LanguageLinkerRule((string *)local_48,this,config);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar4,(string *)local_48);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&vars.Launcher,(string *)local_48);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_180,(string *)&vars.Launcher);
    std::__cxx11::string::~string((string *)&vars.Launcher);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&lang.field_2 + 8));
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    lang.field_2._8_8_ = std::__cxx11::string::c_str();
    cmState::GetTargetTypeName_abi_cxx11_(linkRuleName.field_2._12_4_);
    vars.CMTargetName = (char *)std::__cxx11::string::c_str();
    TargetLinkLanguage((string *)local_310,this,config);
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    vars.Language = "$AIX_EXPORTS";
    TargetLinkLanguage((string *)((long)&responseFlag.field_2 + 8),this,config);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&responseFlag.field_2 + 8),"Swift");
    std::__cxx11::string::~string((string *)(responseFlag.field_2._M_local_buf + 8));
    if (bVar1) {
      vars.FilterPrefix = "$SWIFT_LIBRARY_NAME";
      vars.SwiftLibraryName = "$SWIFT_MODULE";
      vars.SwiftModule = "$SWIFT_MODULE_NAME";
      vars.SwiftOutputFileMapOption = "$SWIFT_SOURCES";
      vars.LanguageCompileFlags = "$DEFINES";
      vars.ObjectFileDir = "$FLAGS";
      vars.Defines = "$INCLUDES";
    }
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    cmAlphaNum::cmAlphaNum(&local_3a0,"CMAKE_");
    TargetLinkLanguage((string *)((long)&cmakeLinkVar.field_2 + 8),this,config);
    cmAlphaNum::cmAlphaNum(&local_3d0,(string *)((long)&cmakeLinkVar.field_2 + 8));
    cmStrCat<>((string *)local_370,&local_3a0,&local_3d0);
    std::__cxx11::string::~string((string *)(cmakeLinkVar.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   "_RESPONSE_FILE_LINK_FLAG");
    this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    local_418 = cmMakefile::GetDefinition(this_00,(string *)&flag);
    bVar1 = cmValue::operator_cast_to_bool(&local_418);
    if (bVar1) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_418);
      std::__cxx11::string::operator=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),(string *)psVar7);
    }
    else {
      std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
    }
    if ((useResponseFile) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rule.DepType.field_2._M_local_buf + 8));
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar4);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in_newline");
      }
      std::__cxx11::string::operator+=
                ((string *)(rule.RspFile.field_2._M_local_buf + 8)," $LINK_PATH $LINK_LIBRARIES");
      TargetLinkLanguage((string *)((long)&targetVersionMajor.field_2 + 8),this,config);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&targetVersionMajor.field_2 + 8),"Swift");
      std::__cxx11::string::~string((string *)(targetVersionMajor.field_2._M_local_buf + 8));
      if (bVar1) {
        vars.SwiftOutputFileMapOption = (char *)std::__cxx11::string::c_str();
      }
      else {
        vars.AIXExports = (char *)std::__cxx11::string::c_str();
      }
      vars.Target = "";
    }
    else {
      vars.AIXExports = "$in";
      vars.Target = "$LINK_PATH $LINK_LIBRARIES";
    }
    vars.Object = "$OBJECT_DIR";
    vars.Objects = "$TARGET_FILE";
    vars.ObjectsQuoted = "$SONAME_FLAG";
    vars.SONameFlag = "$SONAME";
    vars.TargetSOName = "$INSTALLNAME_DIR";
    vars.CMTargetType = "$TARGET_PDB";
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_478);
    std::__cxx11::ostringstream::ostringstream(local_5f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetTargetVersion(pcVar3,&local_76c,&local_770);
    std::ostream::operator<<(local_5f0,local_76c);
    std::ostream::operator<<(&minor,local_770);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_790);
    std::__cxx11::string::~string(local_790);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_478,(string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_5f0);
    vars.TargetCompilePDB = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMajor = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = "$FLAGS";
    vars.TargetInstallNameDir = "$LINK_FLAGS";
    vars.LinkFlags = "$MANIFESTS";
    std::__cxx11::string::string((string *)(linkerLauncher.field_2._M_local_buf + 8));
    if (linkRuleName.field_2._12_4_ != 0) {
      std::__cxx11::string::operator+=
                ((string *)(linkerLauncher.field_2._M_local_buf + 8),
                 "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS");
      vars.Manifests = (char *)std::__cxx11::string::c_str();
    }
    cmCommonTargetGenerator::GetLinkerLauncher
              ((string *)local_7f0,(cmCommonTargetGenerator *)this,config);
    sVar8 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_7f0);
    bVar1 = cmNonempty(sVar8);
    if (bVar1) {
      vars.RegisterFile = (char *)std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"RULE_LAUNCH_LINK",&local_849);
    local_828 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar6,pcVar3,&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
    local_858 = local_828.Value;
    bVar1 = cmNonempty(local_828);
    if (bVar1) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_828);
      cmAlphaNum::cmAlphaNum(&local_8a8,psVar7);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&rulePlaceholderExpander,' ');
      cmStrCat<>(&local_878,&local_8a8,(cmAlphaNum *)&rulePlaceholderExpander);
      std::__cxx11::string::operator=((string *)&val,(string *)&local_878);
      std::__cxx11::string::~string((string *)&local_878);
    }
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar2 = (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&linkCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (pointer)CONCAT44(extraout_var,iVar2));
    ComputeLinkCmd((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,this,config);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&linkCmd), bVar1) {
      local_918 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmAlphaNum::cmAlphaNum(&local_968,(string *)&val);
      cmAlphaNum::cmAlphaNum(&local_998,local_918);
      cmStrCat<>(&local_938,&local_968,&local_998);
      std::__cxx11::string::operator=((string *)local_918,(string *)&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkCmds.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_10d8 = (cmOutputConverter *)0x0;
      if (pcVar6 != (cmLocalNinjaGenerator *)0x0) {
        local_10d8 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_10d8,local_918,(RuleVariables *)((long)&lang.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    local_9b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_9a8,&local_9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"$PRE_LINK",&local_9d1);
    local_9e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2,local_9a8,&local_9d0);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::allocator<char>::~allocator(&local_9d1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
               (char (*) [12])"$POST_BUILD");
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::string((string *)&local_a20);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_a00,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,config,config,&local_a20,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    cmAlphaNum::cmAlphaNum(&local_a70,"Rule for linking ");
    TargetLinkLanguage(&local_ac0,this,config);
    cmAlphaNum::cmAlphaNum(&local_aa0,&local_ac0);
    local_ac1 = ' ';
    local_ad0 = GetVisibleTypeName(this);
    local_ad1 = '.';
    cmStrCat<char,char_const*,char>
              (&local_a40,&local_a70,&local_aa0,&local_ac1,&local_ad0,&local_ad1);
    std::__cxx11::string::operator=
              ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_ac0);
    cmAlphaNum::cmAlphaNum(&local_b28,"Linking ");
    TargetLinkLanguage(&local_b78,this,config);
    cmAlphaNum::cmAlphaNum(&local_b58,&local_b78);
    local_b79 = ' ';
    tgtNames.SharedObject.field_2._8_8_ = GetVisibleTypeName(this);
    cmStrCat<char,char_const*,char[14]>
              (&local_af8,&local_b28,&local_b58,&local_b79,
               (char **)((long)&tgtNames.SharedObject.field_2 + 8),(char (*) [14])0xd5734c);
    std::__cxx11::string::operator=
              ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&local_af8);
    std::__cxx11::string::~string((string *)&local_af8);
    std::__cxx11::string::~string((string *)&local_b78);
    std::__cxx11::string::operator=((string *)(rule.RspContent.field_2._M_local_buf + 8),"$RESTAT");
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)local_7f0);
    std::__cxx11::string::~string((string *)(linkerLauncher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&flag);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_310);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_180);
  }
  TargetNames((Names *)((long)&cmakeCommand.field_2 + 8),this,config);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tgtNames.Base.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tgtNames.Output.field_2 + 8));
  if (bVar1) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar3);
    if (!bVar1) {
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      rule_1._288_8_ = sVar8._M_len;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_c68,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,sVar8,SHELL);
      if (linkRuleName.field_2._12_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_dc0,"CMAKE_SYMLINK_EXECUTABLE",
                   (allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_da0,&local_dc0);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_de0);
        std::operator+(&local_e00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c68," -E cmake_symlink_executable $in $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_de0,&local_e00);
        std::__cxx11::string::~string((string *)&local_e00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_de0,
                   (char (*) [12])"$POST_BUILD");
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&rule_2.Generator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_e20,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_de0,config,config,(string *)&rule_2.Generator,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Name.field_2._M_local_buf + 8),(string *)&local_e20);
        std::__cxx11::string::~string((string *)&local_e20);
        std::__cxx11::string::~string((string *)&rule_2.Generator);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_de0);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Command.field_2._M_local_buf + 8),
                   "Creating executable symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Description.field_2._M_local_buf + 8),
                   "Rule for creating executable symlink.");
        pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_da0);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_da0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f88,"CMAKE_SYMLINK_LIBRARY",
                   (allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_f68,&local_f88);
        std::__cxx11::string::~string((string *)&local_f88);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_fa8);
        std::operator+(&local_fc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c68," -E cmake_symlink_library $in $SONAME $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_fa8,&local_fc8);
        std::__cxx11::string::~string((string *)&local_fc8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_fa8,
                   (char (*) [12])"$POST_BUILD");
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&local_1008);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_fe8,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_fa8,config,config,&local_1008,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Name.field_2._M_local_buf + 8),(string *)&local_fe8);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::__cxx11::string::~string((string *)&local_1008);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_fa8);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Command.field_2._M_local_buf + 8),
                   "Creating library symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Description.field_2._M_local_buf + 8),
                   "Rule for creating library symlink.");
        pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_f68);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_f68);
      }
      std::__cxx11::string::~string((string *)local_c68);
    }
  }
  cmGeneratorTarget::Names::~Names((Names *)((long)&cmakeCommand.field_2 + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}